

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiViewportP *
ImGui::AddUpdateViewport
          (ImGuiWindow *window,ImGuiID id,ImVec2 *pos,ImVec2 *size,ImGuiViewportFlags flags)

{
  int *piVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiViewportP **ppIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImGuiContext *pIVar9;
  int iVar10;
  long lVar11;
  ImGuiViewportP *this;
  ImGuiViewportP **__dest;
  int iVar12;
  int iVar13;
  long lVar14;
  ImGuiContext *g;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  pIVar9 = GImGui;
  if (id == 0) {
    __assert_fail("id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x2c3c,
                  "ImGuiViewportP *ImGui::AddUpdateViewport(ImGuiWindow *, ImGuiID, const ImVec2 &, const ImVec2 &, ImGuiViewportFlags)"
                 );
  }
  if (window != (ImGuiWindow *)0x0) {
    if ((GImGui->MovingWindow != (ImGuiWindow *)0x0) && (GImGui->MovingWindow->RootWindow == window)
       ) {
      flags = flags | 0x14;
    }
    uVar15 = flags | 0x10;
    if ((~window->Flags & 0x40200U) != 0) {
      uVar15 = flags;
    }
    flags = (uint)window->Flags >> 10 & 4 | uVar15;
  }
  lVar11 = (long)(GImGui->Viewports).Size;
  if (0 < lVar11) {
    lVar14 = 0;
    do {
      this = (GImGui->Viewports).Data[lVar14];
      if ((this->super_ImGuiViewport).ID == id) {
        if ((this->super_ImGuiViewport).PlatformRequestMove == false) {
          (this->super_ImGuiViewport).Pos = *pos;
        }
        if ((this->super_ImGuiViewport).PlatformRequestResize == false) {
          (this->super_ImGuiViewport).Size = *size;
        }
        (this->super_ImGuiViewport).Flags = (this->super_ImGuiViewport).Flags & 0x80U | flags;
        goto LAB_00132530;
      }
      lVar14 = lVar14 + 1;
    } while (lVar11 != lVar14);
    if (GImGui == (ImGuiContext *)0x0) goto LAB_00132352;
  }
  piVar1 = &(GImGui->IO).MetricsActiveAllocations;
  *piVar1 = *piVar1 + 1;
LAB_00132352:
  this = (ImGuiViewportP *)(*GImAllocatorAllocFunc)(0x130,GImAllocatorUserData);
  ImGuiViewportP::ImGuiViewportP(this);
  (this->super_ImGuiViewport).ID = id;
  *(int *)&(this->super_ImGuiViewport).field_0x64 = (pIVar9->Viewports).Size;
  IVar3 = *pos;
  this->LastPos = IVar3;
  (this->super_ImGuiViewport).Pos = IVar3;
  (this->super_ImGuiViewport).Size = *size;
  (this->super_ImGuiViewport).Flags = flags;
  UpdateViewportPlatformMonitor(this);
  iVar10 = (pIVar9->Viewports).Size;
  if (iVar10 == (pIVar9->Viewports).Capacity) {
    if (iVar10 == 0) {
      iVar12 = 8;
    }
    else {
      iVar12 = iVar10 / 2 + iVar10;
    }
    iVar13 = iVar10 + 1;
    if (iVar10 + 1 < iVar12) {
      iVar13 = iVar12;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiViewportP **)(*GImAllocatorAllocFunc)((long)iVar13 << 3,GImAllocatorUserData);
    ppIVar4 = (pIVar9->Viewports).Data;
    if (ppIVar4 != (ImGuiViewportP **)0x0) {
      memcpy(__dest,ppIVar4,(long)(pIVar9->Viewports).Size << 3);
      ppIVar4 = (pIVar9->Viewports).Data;
      if ((ppIVar4 != (ImGuiViewportP **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
    }
    (pIVar9->Viewports).Data = __dest;
    (pIVar9->Viewports).Capacity = iVar13;
    iVar10 = (pIVar9->Viewports).Size;
  }
  else {
    __dest = (pIVar9->Viewports).Data;
  }
  __dest[iVar10] = this;
  (pIVar9->Viewports).Size = (pIVar9->Viewports).Size + 1;
  IVar3 = (this->super_ImGuiViewport).Pos;
  IVar2 = (this->super_ImGuiViewport).Size;
  fVar19 = IVar3.x;
  fVar21 = IVar2.x + fVar19;
  fVar20 = IVar3.y;
  fVar22 = IVar2.y + fVar20;
  fVar5 = (pIVar9->DrawListSharedData).ClipRectFullscreen.x;
  fVar6 = (pIVar9->DrawListSharedData).ClipRectFullscreen.y;
  fVar7 = (pIVar9->DrawListSharedData).ClipRectFullscreen.z;
  fVar8 = (pIVar9->DrawListSharedData).ClipRectFullscreen.w;
  uVar15 = -(uint)(fVar5 < fVar19);
  uVar16 = -(uint)(fVar6 < fVar20);
  uVar17 = -(uint)(fVar21 <= fVar7);
  uVar18 = -(uint)(fVar22 <= fVar8);
  (pIVar9->DrawListSharedData).ClipRectFullscreen.x =
       (float)(~uVar15 & (uint)fVar19 | (uint)fVar5 & uVar15);
  (pIVar9->DrawListSharedData).ClipRectFullscreen.y =
       (float)(~uVar16 & (uint)fVar20 | (uint)fVar6 & uVar16);
  (pIVar9->DrawListSharedData).ClipRectFullscreen.z =
       (float)(~uVar17 & (uint)fVar21 | (uint)fVar7 & uVar17);
  (pIVar9->DrawListSharedData).ClipRectFullscreen.w =
       (float)(~uVar18 & (uint)fVar22 | (uint)fVar8 & uVar18);
  uVar15 = (uint)this->PlatformMonitor;
  if (uVar15 != 0xffffffff) {
    if ((this->PlatformMonitor < 0) || ((pIVar9->PlatformIO).Monitors.Size <= (int)uVar15)) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                    ,0x5c2,
                    "T &ImVector<ImGuiPlatformMonitor>::operator[](int) [T = ImGuiPlatformMonitor]")
      ;
    }
    (this->super_ImGuiViewport).DpiScale = (pIVar9->PlatformIO).Monitors.Data[uVar15].DpiScale;
  }
LAB_00132530:
  this->Window = window;
  this->LastFrameActive = pIVar9->FrameCount;
  if (window != (ImGuiWindow *)0x0) {
    if ((this->super_ImGuiViewport).ID != window->ID) {
      __assert_fail("window == __null || viewport->ID == window->ID",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x2c6d,
                    "ImGuiViewportP *ImGui::AddUpdateViewport(ImGuiWindow *, ImGuiID, const ImVec2 &, const ImVec2 &, ImGuiViewportFlags)"
                   );
    }
    window->ViewportOwned = true;
  }
  return this;
}

Assistant:

ImGuiViewportP* ImGui::AddUpdateViewport(ImGuiWindow* window, ImGuiID id, const ImVec2& pos, const ImVec2& size, ImGuiViewportFlags flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    if (window != NULL)
    {
        if (g.MovingWindow && g.MovingWindow->RootWindow == window)
            flags |= ImGuiViewportFlags_NoInputs | ImGuiViewportFlags_NoFocusOnAppearing;
        if ((window->Flags & ImGuiWindowFlags_NoMouseInputs) && (window->Flags & ImGuiWindowFlags_NoNavInputs))
            flags |= ImGuiViewportFlags_NoInputs;
        if (window->Flags & ImGuiWindowFlags_NoFocusOnAppearing)
            flags |= ImGuiViewportFlags_NoFocusOnAppearing;
    }

    ImGuiViewportP* viewport = (ImGuiViewportP*)FindViewportByID(id);
    if (viewport)
    {
        if (!viewport->PlatformRequestMove)
            viewport->Pos = pos;
        if (!viewport->PlatformRequestResize)
            viewport->Size = size;
        viewport->Flags = flags | (viewport->Flags & ImGuiViewportFlags_Minimized); // Preserve existing flags
    }
    else
    {
        // New viewport
        viewport = IM_NEW(ImGuiViewportP)();
        viewport->ID = id;
        viewport->Idx = g.Viewports.Size;
        viewport->Pos = viewport->LastPos = pos;
        viewport->Size = size;
        viewport->Flags = flags;
        UpdateViewportPlatformMonitor(viewport);
        g.Viewports.push_back(viewport);
        IMGUI_DEBUG_LOG_VIEWPORT("Add Viewport %08X (%s)\n", id, window->Name);

        // We normally setup for all viewports in NewFrame() but here need to handle the mid-frame creation of a new viewport.
        // We need to extend the fullscreen clip rect so the OverlayDrawList clip is correct for that the first frame
        g.DrawListSharedData.ClipRectFullscreen.x = ImMin(g.DrawListSharedData.ClipRectFullscreen.x, viewport->Pos.x);
        g.DrawListSharedData.ClipRectFullscreen.y = ImMin(g.DrawListSharedData.ClipRectFullscreen.y, viewport->Pos.y);
        g.DrawListSharedData.ClipRectFullscreen.z = ImMax(g.DrawListSharedData.ClipRectFullscreen.z, viewport->Pos.x + viewport->Size.x);
        g.DrawListSharedData.ClipRectFullscreen.w = ImMax(g.DrawListSharedData.ClipRectFullscreen.w, viewport->Pos.y + viewport->Size.y);

        // Store initial DpiScale before the OS platform window creation, based on expected monitor data.
        // This is so we can select an appropriate font size on the first frame of our window lifetime
        if (viewport->PlatformMonitor != -1)
            viewport->DpiScale = g.PlatformIO.Monitors[viewport->PlatformMonitor].DpiScale;
    }

    viewport->Window = window;
    viewport->LastFrameActive = g.FrameCount;
    IM_ASSERT(window == NULL || viewport->ID == window->ID);

    if (window != NULL)
        window->ViewportOwned = true;

    return viewport;
}